

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Colour.cpp
# Opt level: O0

void __thiscall Colour::~Colour(Colour *this)

{
  Colour *this_local;
  
  if (this->colour != (GLfloat *)0x0) {
    operator_delete(this->colour);
  }
  this->colour = (GLfloat *)0x0;
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

Colour::~Colour() {
    delete colour;
    colour = nullptr;
}